

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

_Bool nuts_has_ipv6(void)

{
  int iVar1;
  nng_sockaddr local_a0;
  nng_udp *local_18;
  nng_udp *u;
  
  local_a0.s_storage.sa_pad[0xd] = 0;
  local_a0.s_storage.sa_pad[0xe] = 0;
  local_a0.s_storage.sa_pad[0xb] = 0;
  local_a0.s_storage.sa_pad[0xc] = 0;
  local_a0.s_storage.sa_pad[9] = 0;
  local_a0.s_storage.sa_pad[10] = 0;
  local_a0.s_storage.sa_pad[7] = 0;
  local_a0.s_storage.sa_pad[8] = 0;
  local_a0.s_storage.sa_pad[5] = 0;
  local_a0.s_storage.sa_pad[6] = 0;
  local_a0.s_storage.sa_pad[0xf] = 0;
  local_a0.s_storage.sa_pad[3] = 0;
  local_a0.s_storage.sa_pad[4] = 0;
  local_a0.s_in6.sa_scope = 0;
  local_a0.s_storage.sa_pad[2] = 0;
  local_a0.s_family = 4;
  local_a0._2_8_ = 0;
  local_a0.s_storage.sa_pad[0]._2_6_ = 0;
  local_a0.s_storage.sa_pad[1]._0_2_ = 0;
  local_a0.s_ipc.sa_path[0x10] = '\0';
  local_a0.s_ipc.sa_path[0x11] = '\x01';
  iVar1 = nng_udp_open(&local_18,&local_a0);
  if (iVar1 == 0) {
    nng_udp_close(local_18);
  }
  return iVar1 == 0;
}

Assistant:

bool
nuts_has_ipv6(void)
{
	nng_sockaddr sa = { 0 };
	nng_udp     *u;
	int          rv;

	sa.s_in6.sa_family = NNG_AF_INET6;
	sa.s_in6.sa_port   = 0;
	memset(sa.s_in6.sa_addr, 0, 16);
	sa.s_in6.sa_addr[15] = 1;

	rv = nng_udp_open(&u, &sa);
	if (rv == 0) {
		nng_udp_close(u);
	}
	return (rv == 0 ? 1 : 0);
}